

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

appender fmt::v8::detail::
         write_significand<char,fmt::v8::appender,char_const*,fmt::v8::detail::digit_grouping<char>>
                   (appender out,char *significand,int significand_size,int exponent,
                   digit_grouping<char> *grouping)

{
  basic_string_view<char> digits;
  back_insert_iterator<fmt::v8::detail::buffer<char>_> bVar1;
  appender out_00;
  undefined1 local_240 [8];
  memory_buffer buffer;
  
  if ((grouping->sep_).thousands_sep == '\0') {
    out_00 = write_significand<char,fmt::v8::appender>(out,significand,significand_size);
    local_240[0] = 0x30;
    bVar1.container = (buffer<char> *)fill_n<fmt::v8::appender,int,char>(out_00,exponent,local_240);
  }
  else {
    buffer.super_buffer<char>._vptr_buffer = (_func_int **)&buffer.super_buffer<char>.capacity_;
    buffer.super_buffer<char>.ptr_ = (char *)0x0;
    local_240 = (undefined1  [8])&PTR_grow_001c1340;
    buffer.super_buffer<char>.size_ = 500;
    write_significand<char,fmt::v8::appender>((appender)local_240,significand,significand_size);
    buffer._535_1_ = 0x30;
    fill_n<fmt::v8::appender,int,char>((appender)local_240,exponent,&buffer.field_0x217);
    digits.size_ = (size_t)buffer.super_buffer<char>.ptr_;
    digits.data_ = (char *)buffer.super_buffer<char>._vptr_buffer;
    bVar1.container =
         (buffer<char> *)digit_grouping<char>::apply<fmt::v8::appender,char>(grouping,out,digits);
    basic_memory_buffer<char,_500UL,_std::allocator<char>_>::deallocate
              ((basic_memory_buffer<char,_500UL,_std::allocator<char>_> *)local_240);
  }
  return (appender)(back_insert_iterator<fmt::v8::detail::buffer<char>_>)bVar1.container;
}

Assistant:

FMT_CONSTEXPR20 auto write_significand(OutputIt out, T significand,
                                       int significand_size, int exponent,
                                       const Grouping& grouping) -> OutputIt {
  if (!grouping.separator()) {
    out = write_significand<Char>(out, significand, significand_size);
    return detail::fill_n(out, exponent, static_cast<Char>('0'));
  }
  auto buffer = memory_buffer();
  write_significand<char>(appender(buffer), significand, significand_size);
  detail::fill_n(appender(buffer), exponent, '0');
  return grouping.apply(out, string_view(buffer.data(), buffer.size()));
}